

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[55]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char (*args_1) [55])

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_128;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_108 [40];
  string local_e0 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_c0;
  function<void()> local_a8 [32];
  tuple<char_data_*&,_const_char_(&)[55]> tuple;
  anon_class_72_3_3bdf3dc2 local_78;
  
  nTimer_local = nTimer;
  local_128 = func;
  if (nTimer < 0) {
    local_108._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_108);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[55]>.
  super__Tuple_impl<1UL,_const_char_(&)[55]>.super__Head_base<1UL,_const_char_(&)[55],_false>.
  _M_head_impl = (_Head_base<1UL,_const_char_(&)[55],_false>)
                 (_Head_base<1UL,_const_char_(&)[55],_false>)args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_const_char_(&)[55]>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_const(&)[55]>(&chs,this,&tuple);
  local_108._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_108 + 8),(string *)from);
  std::__cxx11::string::string(local_e0,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_c0,&chs);
  local_78.func = local_128;
  local_78.args = *args;
  local_78._16_1_ = *(char *)((long)args_1 + 0);
  local_78._17_1_ = *(char *)((long)args_1 + 1);
  local_78._18_1_ = *(char *)((long)args_1 + 2);
  local_78._19_1_ = *(char *)((long)args_1 + 3);
  local_78._20_1_ = *(char *)((long)args_1 + 4);
  local_78._21_1_ = *(char *)((long)args_1 + 5);
  local_78._22_1_ = *(char *)((long)args_1 + 6);
  local_78._23_1_ = *(char *)((long)args_1 + 7);
  local_78._24_1_ = *(char *)((long)args_1 + 8);
  local_78._25_1_ = *(char *)((long)args_1 + 9);
  local_78._26_1_ = *(char *)((long)args_1 + 10);
  local_78._27_1_ = *(char *)((long)args_1 + 0xb);
  local_78._28_1_ = *(char *)((long)args_1 + 0xc);
  local_78._29_1_ = *(char *)((long)args_1 + 0xd);
  local_78._30_1_ = *(char *)((long)args_1 + 0xe);
  local_78._31_1_ = *(char *)((long)args_1 + 0xf);
  local_78._32_1_ = *(char *)((long)args_1 + 0x10);
  local_78._33_1_ = *(char *)((long)args_1 + 0x11);
  local_78._34_1_ = *(char *)((long)args_1 + 0x12);
  local_78._35_1_ = *(char *)((long)args_1 + 0x13);
  local_78._36_1_ = *(char *)((long)args_1 + 0x14);
  local_78._37_1_ = *(char *)((long)args_1 + 0x15);
  local_78._38_1_ = *(char *)((long)args_1 + 0x16);
  local_78._39_1_ = *(char *)((long)args_1 + 0x17);
  local_78._40_1_ = *(char *)((long)args_1 + 0x18);
  local_78._41_1_ = *(char *)((long)args_1 + 0x19);
  local_78._42_1_ = *(char *)((long)args_1 + 0x1a);
  local_78._43_1_ = *(char *)((long)args_1 + 0x1b);
  local_78._44_1_ = *(char *)((long)args_1 + 0x1c);
  local_78._45_1_ = *(char *)((long)args_1 + 0x1d);
  local_78._46_1_ = *(char *)((long)args_1 + 0x1e);
  local_78._47_1_ = *(char *)((long)args_1 + 0x1f);
  local_78._48_1_ = *(char *)((long)args_1 + 0x20);
  local_78._49_1_ = *(char *)((long)args_1 + 0x21);
  local_78._50_1_ = *(char *)((long)args_1 + 0x22);
  local_78._51_1_ = *(char *)((long)args_1 + 0x23);
  local_78._52_1_ = *(char *)((long)args_1 + 0x24);
  local_78._53_1_ = *(char *)((long)args_1 + 0x25);
  local_78._54_1_ = *(char *)((long)args_1 + 0x26);
  local_78._55_1_ = *(char *)((long)args_1 + 0x27);
  local_78._56_7_ = SUB87(*(undefined8 *)(*args_1 + 0x28),0);
  local_78._63_1_ = SUB81(*(undefined8 *)(*args_1 + 0x2f),0);
  local_78._64_7_ = SUB87((ulong)*(undefined8 *)(*args_1 + 0x2f) >> 8,0);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[55]>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[55])::_lambda()_1_,void>
            (local_a8,&local_78);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_108);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_108);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}